

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfTimeCodeAttribute.cpp
# Opt level: O3

void __thiscall
Imf_3_4::TypedAttribute<Imf_3_4::TimeCode>::readValueFrom
          (TypedAttribute<Imf_3_4::TimeCode> *this,IStream *is,int size,int version)

{
  uchar b [4];
  uchar b_1 [4];
  uint local_20;
  uint local_1c;
  
  (*is->_vptr_IStream[3])(is,&local_20,4);
  TimeCode::setTimeAndFlags(&this->_value,local_20,TV60_PACKING);
  (*is->_vptr_IStream[3])(is,&local_1c,4);
  TimeCode::setUserData(&this->_value,local_1c);
  return;
}

Assistant:

IMF_EXPORT void
TimeCodeAttribute::readValueFrom (
    OPENEXR_IMF_INTERNAL_NAMESPACE::IStream& is, int size, int version)
{
    unsigned int tmp;

    Xdr::read<StreamIO> (is, tmp);
    _value.setTimeAndFlags (tmp);

    Xdr::read<StreamIO> (is, tmp);
    _value.setUserData (tmp);
}